

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.h
# Opt level: O0

void __thiscall re2::RegexpStatus::set_tmp(RegexpStatus *this,string *tmp)

{
  string *this_00;
  undefined8 in_RSI;
  long in_RDI;
  
  this_00 = *(string **)(in_RDI + 0x18);
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string(this_00);
    operator_delete(this_00);
  }
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  return;
}

Assistant:

void set_tmp(std::string* tmp) { delete tmp_; tmp_ = tmp; }